

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window,QTouchEvent *te)

{
  State SVar1;
  long lVar2;
  Span *pSVar3;
  undefined1 auVar4 [16];
  char cVar5;
  bool bVar6;
  State SVar7;
  int iVar8;
  KeyboardModifiers modifiers;
  QApplicationPrivate *device;
  iterator p;
  iterator iVar9;
  QObject *pQVar10;
  QWidget *pQVar11;
  pair<QEventPoint::State,_QList<QEventPoint>_> *ppVar12;
  ulong uVar13;
  long lVar14;
  Type eventType;
  QApplicationPrivate *this;
  long in_FS_OFFSET;
  qreal in_XMM1_Qa;
  QWeakPointer<QObject> local_d8;
  QPoint local_c0;
  QWidget *targetWidget;
  qreal local_b0;
  QArrayDataPointer<QEventPoint> local_a8;
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_> local_90;
  QMutableTouchEvent touchEvent;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_90.d = (Data *)0x0;
  device = (QApplicationPrivate *)QPointerEvent::pointingDevice();
  local_a8.d = *(Data **)(te + 0x28);
  local_a8.ptr = *(QEventPoint **)(te + 0x30);
  local_a8.size = *(qsizetype *)(te + 0x38);
  if (local_a8.d != (Data *)0x0) {
    LOCK();
    ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p = QList<QEventPoint>::begin((QList<QEventPoint> *)&local_a8);
  iVar9 = QList<QEventPoint>::end((QList<QEventPoint> *)&local_a8);
  for (; p.i != iVar9.i; p.i = p.i + 1) {
    _touchEvent = (Data *)0x0;
    cVar5 = QEventPoint::state();
    if (cVar5 == '\x01') {
      iVar8 = QInputDevice::type();
      if (iVar8 == 4) {
        pQVar10 = (QObject *)QPointingDevicePrivate::firstActiveTarget();
        QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)&touchEvent,pQVar10);
      }
      if (window == (QWidget *)0x0) {
        targetWidget = (QWidget *)QEventPoint::globalPosition();
        local_b0 = in_XMM1_Qa;
        local_d8.d = (Data *)QPointF::toPoint((QPointF *)&targetWidget);
        window = QApplication::topLevelAt((QPoint *)&local_d8);
        if (window == (QWidget *)0x0) {
          window = (QWidget *)0x0;
          goto LAB_002c17f5;
        }
      }
      targetWidget = (QWidget *)QEventPoint::globalPosition();
      local_b0 = in_XMM1_Qa;
      local_c0 = QPointF::toPoint((QPointF *)&targetWidget);
      local_d8.d = (Data *)QWidget::mapFromGlobal(window,&local_c0);
      pQVar11 = QWidget::childAt(window,(QPoint *)&local_d8);
      QWeakPointer<QObject>::assign<QObject>
                ((QWeakPointer<QObject> *)&touchEvent,&pQVar11->super_QObject);
      bVar6 = QPointer::operator_cast_to_bool((QPointer *)&touchEvent);
      if (!bVar6) {
        QWeakPointer<QObject>::assign<QObject>
                  ((QWeakPointer<QObject> *)&touchEvent,&window->super_QObject);
      }
      this = device;
      iVar8 = QInputDevice::type();
      if (iVar8 == 2) {
        pQVar11 = findClosestTouchPointTarget(this,(QPointingDevice *)device,p.i);
        if ((pQVar11 == (QWidget *)0x0) ||
           ((bVar6 = QWidget::isAncestorOf((QWidget *)0x0,pQVar11), !bVar6 &&
            (bVar6 = QWidget::isAncestorOf(pQVar11,(QWidget *)0x0), !bVar6)))) {
          bVar6 = false;
        }
        else {
          QWeakPointer<QObject>::assign<QObject>
                    ((QWeakPointer<QObject> *)&touchEvent,&pQVar11->super_QObject);
          bVar6 = true;
        }
      }
      else {
        bVar6 = false;
      }
      iVar8 = QInputDevice::type();
      if ((bVar6) || (iVar8 == 4)) {
        QMutableEventPoint::setTarget(p.i,(QObject *)0x0);
      }
LAB_002c17a1:
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_b0;
      _targetWidget = (piter)(auVar4 << 0x40);
      ppVar12 = QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::operator[]
                          (&local_90,&targetWidget);
      SVar1 = ppVar12->first;
      SVar7 = QEventPoint::state();
      ppVar12->first = SVar7 | SVar1;
      QList<QEventPoint>::emplaceBack<QEventPoint_const&>(&ppVar12->second,p.i);
    }
    else {
      pQVar10 = QMutableEventPoint::target(p.i);
      QWeakPointer<QObject>::assign<QObject>((QWeakPointer<QObject> *)&touchEvent,pQVar10);
      bVar6 = QPointer::operator_cast_to_bool((QPointer *)&touchEvent);
      if (bVar6) goto LAB_002c17a1;
    }
LAB_002c17f5:
    QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&touchEvent);
  }
  if ((local_90.d != (Data *)0x0) && ((local_90.d)->size != 0)) {
    _targetWidget =
         (piter)QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::constBegin
                          (&local_90);
    while( true ) {
      if (targetWidget ==
          (Data<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
           *)0x0 && targetWidget._8_8_ == 0) break;
      local_d8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_d8.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
      pSVar3 = targetWidget->spans;
      uVar13 = targetWidget._8_8_ >> 7;
      QPointer<QWidget>::QPointer<void>
                ((QPointer<QWidget> *)&local_d8,
                 *(QWidget **)
                  pSVar3[uVar13].entries[pSVar3[uVar13].offsets[targetWidget._8_4_ & 0x7f]].storage.
                  data);
      if (((QPoint)local_d8.d == (QPoint)0x0) ||
         (pQVar11 = (QWidget *)local_d8.value, *(int *)((long)local_d8.d + 4) == 0)) {
        pQVar11 = (QWidget *)0x0;
      }
      bVar6 = tryModalHelper(pQVar11,(QWidget **)0x0);
      if (bVar6) {
        lVar14 = ((ulong)local_b0 >> 7) * 0x90;
        cVar5 = *(char *)(*(long *)((long)targetWidget->data + lVar14 + 0x80) + 8 +
                         (ulong)*(byte *)((long)targetWidget->data +
                                         (ulong)(targetWidget._8_4_ & 0x7f) + lVar14) * 0x28);
        if (cVar5 == '\x01') {
          eventType = TouchBegin;
        }
        else {
          if (cVar5 == '\x04') goto LAB_002c1b77;
          if (cVar5 == '\b') {
            eventType = TouchEnd;
          }
          else {
            eventType = TouchUpdate;
          }
        }
        _touchEvent = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        modifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
        super_QFlagsStorage<Qt::KeyboardModifier>.i =
             (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)QGuiApplication::keyboardModifiers();
        lVar14 = ((ulong)local_b0 >> 7) * 0x90;
        QMutableTouchEvent::QMutableTouchEvent
                  (&touchEvent,eventType,(QPointingDevice *)device,modifiers,
                   (QList<QEventPoint> *)
                   (*(long *)((long)targetWidget->data + lVar14 + 0x80) +
                    (ulong)*(byte *)((long)targetWidget->data +
                                    (ulong)(targetWidget._8_4_ & 0x7f) + lVar14) * 0x28 + 0x10));
        if (((QPoint)local_d8.d == (QPoint)0x0) ||
           (pQVar11 = (QWidget *)local_d8.value, *(int *)((long)local_d8.d + 4) == 0)) {
          pQVar11 = (QWidget *)0x0;
        }
        bVar6 = updateTouchPointsForWidget(pQVar11,(QTouchEvent *)&touchEvent);
        QPointerEvent::setTimestamp((ulonglong)&touchEvent);
        if (((QPoint)local_d8.d != (QPoint)0x0) && (bVar6)) {
          QWidget::setAttribute((QWidget *)local_d8.value,WA_WState_AcceptedTouchBeginEvent,true);
        }
        bVar6 = QWidget::testAttribute_helper
                          ((QWidget *)local_d8.value,WA_WState_AcceptedTouchBeginEvent);
        if (bVar6) {
LAB_002c1a97:
          if (te[0xb] == (QTouchEvent)0x1) {
            if (((QPoint)local_d8.d == (QPoint)0x0) ||
               (pQVar11 = (QWidget *)local_d8.value, *(int *)((long)local_d8.d + 4) == 0)) {
              pQVar11 = (QWidget *)0x0;
            }
            QCoreApplication::sendSpontaneousEvent(&pQVar11->super_QObject,(QEvent *)&touchEvent);
          }
          else {
            if (((QPoint)local_d8.d == (QPoint)0x0) ||
               (pQVar11 = (QWidget *)local_d8.value, *(int *)((long)local_d8.d + 4) == 0)) {
              pQVar11 = (QWidget *)0x0;
            }
            QCoreApplication::sendEvent(&pQVar11->super_QObject,(QEvent *)&touchEvent);
          }
        }
        else {
          if (((QPoint)local_d8.d == (QPoint)0x0) ||
             (pQVar11 = (QWidget *)local_d8.value, *(int *)((long)local_d8.d + 4) == 0)) {
            pQVar11 = (QWidget *)0x0;
          }
          bVar6 = QGestureManager::gesturePending(&pQVar11->super_QObject);
          if (bVar6) goto LAB_002c1a97;
        }
        QMutableTouchEvent::~QMutableTouchEvent(&touchEvent);
      }
LAB_002c1b77:
      QWeakPointer<QObject>::~QWeakPointer(&local_d8);
      QHashPrivate::
      iterator<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
      ::operator++((iterator<QHashPrivate::Node<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>_>
                    *)&targetWidget);
    }
  }
  QArrayDataPointer<QEventPoint>::~QArrayDataPointer(&local_a8);
  QHash<QWidget_*,_std::pair<QEventPoint::State,_QList<QEventPoint>_>_>::~QHash(&local_90);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool QApplicationPrivate::translateRawTouchEvent(QWidget *window, const QTouchEvent *te)
{
    QApplicationPrivate *d = self;
    // TODO get rid of this std::pair
    typedef std::pair<QEventPoint::State, QList<QEventPoint> > StatesAndTouchPoints;
    QHash<QWidget *, StatesAndTouchPoints> widgetsNeedingEvents;

    const auto *device = te->pointingDevice();
    auto touchPoints = te->points(); // touch points will be mutated
    for (auto &touchPoint : touchPoints) {
        // update state
        QPointer<QObject> target;
        if (touchPoint.state() == QEventPoint::State::Pressed) {
            if (device->type() == QInputDevice::DeviceType::TouchPad) {
                // on touchpads, send all touch points to the same widget:
                // pick the first non-null target if possible
                target = QPointingDevicePrivate::get(device)->firstActiveTarget();
            }

            if (target.isNull()) {
                // determine which widget this event will go to
                if (!window)
                    window = QApplication::topLevelAt(touchPoint.globalPosition().toPoint());
                if (!window)
                    continue;
                target = window->childAt(window->mapFromGlobal(touchPoint.globalPosition().toPoint()));
                if (!target)
                    target = window;
            }

            bool usingClosestWidget = false;
            if (device->type() == QInputDevice::DeviceType::TouchScreen) {
                QWidget *closestWidget = d->findClosestTouchPointTarget(device, touchPoint);
                QWidget *widget = static_cast<QWidget *>(target.data());
                if (closestWidget
                        && (widget->isAncestorOf(closestWidget) || closestWidget->isAncestorOf(widget))) {
                    target = closestWidget;
                    usingClosestWidget = true;
                }
            }

            // on touch pads, implicitly grab all touch points
            // on touch screens, grab touch points that are redirected to the closest widget
            if (device->type() == QInputDevice::DeviceType::TouchPad || usingClosestWidget)
                QMutableEventPoint::setTarget(touchPoint, target);
        } else {
            target = QMutableEventPoint::target(touchPoint);
            if (!target)
                continue;
        }
        Q_ASSERT(!target.isNull());

        QWidget *targetWidget = static_cast<QWidget *>(target.data());

#ifdef Q_OS_MACOS
        // Single-touch events are normally not sent unless WA_TouchPadAcceptSingleTouchEvents is set.
        // In Qt 4 this check was in OS X-only code. That behavior is preserved here by the #ifdef.
        if (touchPoints.count() == 1
            && device->type() == QInputDevice::DeviceType::TouchPad
            && !targetWidget->testAttribute(Qt::WA_TouchPadAcceptSingleTouchEvents))
            continue;
#endif

        StatesAndTouchPoints &maskAndPoints = widgetsNeedingEvents[targetWidget];
        maskAndPoints.first = QEventPoint::State(maskAndPoints.first | touchPoint.state());
        maskAndPoints.second.append(touchPoint);
    }

    if (widgetsNeedingEvents.isEmpty())
        return false;

    bool accepted = false;
    QHash<QWidget *, StatesAndTouchPoints>::ConstIterator it = widgetsNeedingEvents.constBegin();
    const QHash<QWidget *, StatesAndTouchPoints>::ConstIterator end = widgetsNeedingEvents.constEnd();
    for (; it != end; ++it) {
        const QPointer<QWidget> widget = it.key();
        if (!QApplicationPrivate::tryModalHelper(widget, nullptr))
            continue;

        QEvent::Type eventType;
        switch (it.value().first) {
        case QEventPoint::State::Pressed:
            eventType = QEvent::TouchBegin;
            break;
        case QEventPoint::State::Released:
            eventType = QEvent::TouchEnd;
            break;
        case QEventPoint::State::Stationary:
            // don't send the event if nothing changed
            continue;
        default:
            eventType = QEvent::TouchUpdate;
            break;
        }

        QMutableTouchEvent touchEvent(eventType, device, QGuiApplication::keyboardModifiers(),
                                      it.value().second);
        bool containsPress = updateTouchPointsForWidget(widget, &touchEvent);
        touchEvent.setTimestamp(te->timestamp());
        touchEvent.setTarget(widget);

        if (containsPress)
            widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);

        switch (touchEvent.type()) {
        case QEvent::TouchBegin:
        {
            // if the TouchBegin handler recurses, we assume that means the event
            // has been implicitly accepted and continue to send touch events
            bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                         : QApplication::sendEvent(widget, &touchEvent);
            if (res && touchEvent.isAccepted()) {
                accepted = true;
                if (!widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent);
            }
            break;
        }
        default:
            if (widget->testAttribute(Qt::WA_WState_AcceptedTouchBeginEvent)
#ifndef QT_NO_GESTURES
                || QGestureManager::gesturePending(widget)
#endif
                ) {
                bool res = te->spontaneous() ? QApplication::sendSpontaneousEvent(widget, &touchEvent)
                                            : QApplication::sendEvent(widget, &touchEvent);
                if (res && touchEvent.isAccepted())
                    accepted = true;
                // widget can be deleted on TouchEnd
                if (touchEvent.type() == QEvent::TouchEnd && !widget.isNull())
                    widget->setAttribute(Qt::WA_WState_AcceptedTouchBeginEvent, false);
            }
            break;
        }
    }
    return accepted;
}